

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

Aig_Obj_t * Aig_Compose(Aig_Man_t *p,Aig_Obj_t *pRoot,Aig_Obj_t *pFunc,int iVar)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pVar;
  int iVar_local;
  Aig_Obj_t *pFunc_local;
  Aig_Obj_t *pRoot_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManCiNum(p);
  if (iVar < iVar1) {
    pAVar2 = Aig_Regular(pRoot);
    pVar = Aig_ManCi(p,iVar);
    Aig_Compose_rec(p,pAVar2,pFunc,pVar);
    pAVar2 = Aig_Regular(pRoot);
    Aig_ConeUnmark_rec(pAVar2);
    pAVar2 = Aig_Regular(pRoot);
    pAVar2 = (Aig_Obj_t *)(pAVar2->field_5).pData;
    iVar1 = Aig_IsComplement(pRoot);
    p_local = (Aig_Man_t *)Aig_NotCond(pAVar2,iVar1);
  }
  else {
    printf("Aig_Compose(): The PI variable %d is not defined.\n",(ulong)(uint)iVar);
    p_local = (Aig_Man_t *)0x0;
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Aig_Compose( Aig_Man_t * p, Aig_Obj_t * pRoot, Aig_Obj_t * pFunc, int iVar )
{
    // quit if the PI variable is not defined
    if ( iVar >= Aig_ManCiNum(p) )
    {
        printf( "Aig_Compose(): The PI variable %d is not defined.\n", iVar );
        return NULL;
    }
    // recursively perform composition
    Aig_Compose_rec( p, Aig_Regular(pRoot), pFunc, Aig_ManCi(p, iVar) );
    // clear the markings
    Aig_ConeUnmark_rec( Aig_Regular(pRoot) );
    return Aig_NotCond( (Aig_Obj_t *)Aig_Regular(pRoot)->pData, Aig_IsComplement(pRoot) );
}